

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacintoshIMG.cpp
# Opt level: O3

void __thiscall Storage::Disk::MacintoshIMG::MacintoshIMG(MacintoshIMG *this,string *file_name)

{
  FileHolder *this_00;
  pointer puVar1;
  pointer puVar2;
  byte bVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined4 *puVar8;
  size_t in_RCX;
  FILE *local_48;
  _Alloc_hider _Stack_40;
  pointer local_38;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__MacintoshIMG_005a27c0;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->is_diskCopy_file_ = false;
  (this->buffer_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->buffer_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->buffer_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->buffer_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->buffer_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->raw_offset_ = 0;
  bVar3 = FileHolder::get8(this_00);
  if ((bVar3 == 0x4c) || (bVar3 == 0)) {
    uVar4 = FileHolder::get8(this_00);
    if (uVar4 == '\0' && bVar3 == 0 || uVar4 == 'K' && bVar3 == 0x4c) {
      construct_raw_gcr(this,0,0);
      return;
    }
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0xfffffffe;
    __cxa_throw(puVar8,&Error::typeinfo,0);
  }
  this->is_diskCopy_file_ = true;
  if (0x40 < bVar3) {
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0xfffffffe;
    __cxa_throw(puVar8,&Error::typeinfo,0);
  }
  FileHolder::seek(this_00,0x40,0);
  uVar6 = FileHolder::get32be(this_00);
  uVar7 = FileHolder::get32be(this_00);
  FileHolder::get32be(this_00);
  FileHolder::get32be(this_00);
  if (uVar6 != 0) {
    bVar3 = FileHolder::get8(this_00);
    if (3 < bVar3) {
      puVar8 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar8 = 0xfffffffe;
      __cxa_throw(puVar8,&Error::typeinfo,0);
    }
    this->encoding_ = (uint)bVar3;
    uVar4 = FileHolder::get8(this_00);
    this->format_ = uVar4;
    uVar5 = FileHolder::get16be(this_00);
    if (uVar5 == 0x100) {
      FileHolder::read((FileHolder *)&stack0xffffffffffffffb8,(int)this_00,(pointer)(ulong)uVar6,
                       in_RCX);
      puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_48;
      (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Stack_40._M_p;
      (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_38;
      local_48 = (FILE *)0x0;
      _Stack_40._M_p = (pointer)0x0;
      local_38 = (pointer)0x0;
      if ((puVar1 != (pointer)0x0) &&
         (operator_delete(puVar1,(long)puVar2 - (long)puVar1), local_48 != (FILE *)0x0)) {
        operator_delete(local_48,(long)local_38 - (long)local_48);
      }
      FileHolder::read((FileHolder *)&stack0xffffffffffffffb8,(int)this_00,(pointer)(ulong)uVar7,
                       in_RCX);
      puVar1 = (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_48;
      (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Stack_40._M_p;
      (this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_38;
      local_48 = (FILE *)0x0;
      _Stack_40._M_p = (pointer)0x0;
      local_38 = (pointer)0x0;
      if ((puVar1 != (pointer)0x0) &&
         (operator_delete(puVar1,(long)puVar2 - (long)puVar1), local_48 != (FILE *)0x0)) {
        operator_delete(local_48,(long)local_38 - (long)local_48);
      }
      if (((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == (pointer)(ulong)uVar6) &&
         ((this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish +
          -(long)(this->tags_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start == (pointer)(ulong)uVar7)) {
        return;
      }
    }
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0xfffffffe;
    __cxa_throw(puVar8,&Error::typeinfo,0);
  }
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0xfffffffe;
  __cxa_throw(puVar8,&Error::typeinfo,0);
}

Assistant:

MacintoshIMG::MacintoshIMG(const std::string &file_name) :
	file_(file_name) {

	// Test 1: is this a raw sector dump? If so it'll start with
	// either the magic word 0x4C4B (big endian) or with 0x0000
	// and be exactly 819,200 bytes long if double sided, or
	// 409,600 bytes if single sided.
	//
	// Luckily, both 0x00 and 0x4c are invalid string length for the proper
	// DiskCopy 4.2 format, so there's no ambiguity here.
	const auto name_length = file_.get8();
	if(name_length == 0x4c || !name_length) {
		uint32_t magic_word = file_.get8();
		if(!((name_length == 0x4c && magic_word == 0x4b) || (name_length == 0x00 && magic_word == 0x00)))
			throw Error::InvalidFormat;

		construct_raw_gcr(0);
	} else {
		// DiskCopy 4.2 it is then:
		//
		// File format starts with 64 bytes dedicated to the disk name;
		// this is a Pascal-style string though there is apparently a
		// bug in one version of Disk Copy that can cause the length to
		// be one too high.
		//
		// Validate the length, then skip the rest of the string.
		is_diskCopy_file_ = true;
		if(name_length > 64)
			throw Error::InvalidFormat;

		// Get the length of the data and tag blocks.
		file_.seek(64, SEEK_SET);
		const auto data_block_length = file_.get32be();
		const auto tag_block_length = file_.get32be();
		const auto data_checksum = file_.get32be();
		const auto tag_checksum = file_.get32be();

		// Don't continue with no data.
		if(!data_block_length)
			throw Error::InvalidFormat;

		// Check that this is a comprehensible disk encoding.
		const auto encoding = file_.get8();
		switch(encoding) {
			default: throw Error::InvalidFormat;

			case 0:	encoding_ = Encoding::GCR400;	break;
			case 1:	encoding_ = Encoding::GCR800;	break;
			case 2:	encoding_ = Encoding::MFM720;	break;
			case 3:	encoding_ = Encoding::MFM1440;	break;
		}
		format_ = file_.get8();

		// Check the magic number.
		const auto magic_number = file_.get16be();
		if(magic_number != 0x0100)
			throw Error::InvalidFormat;

		// Read the data and tags, and verify that enough data
		// was present.
		data_ = file_.read(data_block_length);
		tags_ = file_.read(tag_block_length);

		if(data_.size() != data_block_length || tags_.size() != tag_block_length)
			throw Error::InvalidFormat;

		// Verify the two checksums.
		const auto computed_data_checksum = checksum(data_);
		const auto computed_tag_checksum = checksum(tags_, 12);

		/*
			Yuck! It turns out that at least some disk images have incorrect checksums,
			and other emulators accept them regardless. So this test is disabled, at least
			for now. It'd probably be smarter to accept the disk image as provisionally
			incorrect and somehow communicate the issue to the user? Or, much better,
			verify the filesystem if the checksums don't match.
		*/
		(void)data_checksum;
		(void)computed_data_checksum;
		(void)tag_checksum;
		(void)computed_tag_checksum;

//		if(computed_tag_checksum != tag_checksum || computed_data_checksum != data_checksum)
//			throw Error::InvalidFormat;
	}
}